

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O1

void __thiscall
VmaBlockMetadata::PrintDetailedMap_UnusedRange
          (VmaBlockMetadata *this,VmaJsonWriter *json,VkDeviceSize offset,VkDeviceSize size)

{
  VmaVector<char,_VmaStlAllocator<char>_> *pVVar1;
  size_t sVar2;
  
  VmaJsonWriter::BeginObject(json,true);
  VmaJsonWriter::BeginString(json,"Offset");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteNumber(json,offset);
  VmaJsonWriter::BeginString(json,"Type");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::BeginString(json,"FREE");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::BeginString(json,"Size");
  pVVar1 = &json->m_SB->m_Data;
  sVar2 = pVVar1->m_Count;
  VmaVector<char,_VmaStlAllocator<char>_>::resize(pVVar1,sVar2 + 1);
  pVVar1->m_pArray[sVar2] = '\"';
  json->m_InsideString = false;
  VmaJsonWriter::WriteNumber(json,size);
  VmaJsonWriter::EndObject(json);
  return;
}

Assistant:

void VmaBlockMetadata::PrintDetailedMap_UnusedRange(class VmaJsonWriter& json,
    VkDeviceSize offset, VkDeviceSize size) const
{
    json.BeginObject(true);

    json.WriteString("Offset");
    json.WriteNumber(offset);

    json.WriteString("Type");
    json.WriteString(VMA_SUBALLOCATION_TYPE_NAMES[VMA_SUBALLOCATION_TYPE_FREE]);

    json.WriteString("Size");
    json.WriteNumber(size);

    json.EndObject();
}